

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O0

void anon_unknown.dwarf_3336::Test_TemplateTestUtilTest_GetSectionDictionaries::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  bool bVar10;
  int iVar11;
  reference ppTVar12;
  char *pcVar13;
  TemplateString local_308;
  TemplateDictionaryPeer local_2e8;
  TemplateDictionaryPeer peer_section1;
  TemplateDictionaryPeer local_2c0;
  TemplateDictionaryPeer peer_section0;
  undefined1 local_298 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts_2;
  TemplateDictionaryPeer peer_2;
  size_t sStack_270;
  undefined8 local_268;
  TemplateId TStack_260;
  TemplateString local_258;
  TemplateString local_238;
  TemplateString local_218;
  TemplateString local_1f8;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateDictionaryPeer local_198;
  TemplateDictionaryPeer peer_section;
  undefined1 local_170 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts_1;
  TemplateDictionaryPeer peer_1;
  size_t sStack_148;
  undefined8 local_140;
  TemplateId TStack_138;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  value_type local_d0;
  undefined1 local_c8 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"test_GetSectionDictionaries");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_c8);
  local_d0 = (value_type)0x0;
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::push_back((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
               *)local_c8,&local_d0);
  ctemplate::TemplateString::TemplateString(&local_f0,"SECTION");
  iVar11 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     (&local_a0,&local_f0,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_c8);
  if (iVar11 != 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","0","==",
            "peer.GetSectionDictionaries(\"SECTION\", &dicts)");
    exit(1);
  }
  bVar10 = std::
           vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
           ::empty((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                    *)local_c8);
  if (!bVar10) {
    fprintf(_stderr,"Check failed: %s\n","dicts.empty()");
    exit(1);
  }
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             *)local_c8);
  ctemplate::TemplateString::TemplateString(&local_110,"SECTION");
  TVar1.length_ = local_110.length_;
  TVar1.ptr_ = local_110.ptr_;
  TVar1.is_immutable_ = local_110.is_immutable_;
  TVar1._17_7_ = local_110._17_7_;
  TVar1.id_ = local_110.id_;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_130,"SECTION_VALUE");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer_1,"0");
  TVar2.length_ = local_130.length_;
  TVar2.ptr_ = local_130.ptr_;
  TVar2.is_immutable_ = local_130.is_immutable_;
  TVar2._17_7_ = local_130._17_7_;
  TVar2.id_ = local_130.id_;
  TVar7.length_ = sStack_148;
  TVar7.ptr_ = (char *)peer_1.dict_;
  TVar7._16_8_ = local_140;
  TVar7.id_ = TStack_138;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar7);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer
            ((TemplateDictionaryPeer *)
             &dicts_1.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_78);
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_170);
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer_section,"SECTION");
  iVar11 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     ((TemplateDictionaryPeer *)
                      &dicts_1.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (TemplateString *)&peer_section,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_170);
  if (iVar11 != 1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","1","==",
            "peer.GetSectionDictionaries(\"SECTION\", &dicts)");
    exit(1);
  }
  ppTVar12 = std::
             vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           *)local_170,0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_198,*ppTVar12);
  ctemplate::TemplateString::TemplateString(&local_1b8,"SECTION_VALUE");
  pcVar13 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_198,&local_1b8);
  iVar11 = strcmp("0",pcVar13);
  if (iVar11 == 0) {
    std::
    vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
    ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
               *)local_170);
    ctemplate::TemplateString::TemplateString(&local_1d8,"SECTION");
    TVar3.length_ = local_1d8.length_;
    TVar3.ptr_ = local_1d8.ptr_;
    TVar3.is_immutable_ = local_1d8.is_immutable_;
    TVar3._17_7_ = local_1d8._17_7_;
    TVar3.id_ = local_1d8.id_;
    ctemplate::TemplateDictionary::AddSectionDictionary(TVar3);
    ctemplate::TemplateString::TemplateString(&local_1f8,"SECTION_VALUE");
    ctemplate::TemplateString::TemplateString(&local_218,"1");
    TVar4.length_ = local_1f8.length_;
    TVar4.ptr_ = local_1f8.ptr_;
    TVar4.is_immutable_ = local_1f8.is_immutable_;
    TVar4._17_7_ = local_1f8._17_7_;
    TVar4.id_ = local_1f8.id_;
    TVar8.length_ = local_218.length_;
    TVar8.ptr_ = local_218.ptr_;
    TVar8.is_immutable_ = local_218.is_immutable_;
    TVar8._17_7_ = local_218._17_7_;
    TVar8.id_ = local_218.id_;
    ctemplate::TemplateDictionary::SetValue(TVar4,TVar8);
    ctemplate::TemplateString::TemplateString(&local_238,"ANOTHER_SECTION");
    TVar5.length_ = local_238.length_;
    TVar5.ptr_ = local_238.ptr_;
    TVar5.is_immutable_ = local_238.is_immutable_;
    TVar5._17_7_ = local_238._17_7_;
    TVar5.id_ = local_238.id_;
    ctemplate::TemplateDictionary::AddSectionDictionary(TVar5);
    ctemplate::TemplateString::TemplateString(&local_258,"ANOTHER_VALUE");
    ctemplate::TemplateString::TemplateString((TemplateString *)&peer_2,"2");
    TVar6.length_ = local_258.length_;
    TVar6.ptr_ = local_258.ptr_;
    TVar6.is_immutable_ = local_258.is_immutable_;
    TVar6._17_7_ = local_258._17_7_;
    TVar6.id_ = local_258.id_;
    TVar9.length_ = sStack_270;
    TVar9.ptr_ = (char *)peer_2.dict_;
    TVar9._16_8_ = local_268;
    TVar9.id_ = TStack_260;
    ctemplate::TemplateDictionary::SetValue(TVar6,TVar9);
    ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer
              ((TemplateDictionaryPeer *)
               &dicts_2.
                super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_78);
    std::
    vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
    ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              *)local_298);
    ctemplate::TemplateString::TemplateString((TemplateString *)&peer_section0,"SECTION");
    iVar11 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                       ((TemplateDictionaryPeer *)
                        &dicts_2.
                         super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (TemplateString *)&peer_section0,
                        (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                         *)local_298);
    if (iVar11 != 2) {
      fprintf(_stderr,"Check failed: %s %s %s\n","2","==",
              "peer.GetSectionDictionaries(\"SECTION\", &dicts)");
      exit(1);
    }
    ppTVar12 = std::
               vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
               ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                             *)local_298,0);
    ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_2c0,*ppTVar12);
    ctemplate::TemplateString::TemplateString((TemplateString *)&peer_section1,"SECTION_VALUE");
    pcVar13 = ctemplate::TemplateDictionaryPeer::GetSectionValue
                        (&local_2c0,(TemplateString *)&peer_section1);
    iVar11 = strcmp("0",pcVar13);
    if (iVar11 == 0) {
      ppTVar12 = std::
                 vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                 ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                               *)local_298,1);
      ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_2e8,*ppTVar12);
      ctemplate::TemplateString::TemplateString(&local_308,"SECTION_VALUE");
      pcVar13 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_2e8,&local_308);
      iVar11 = strcmp("1",pcVar13);
      if (iVar11 == 0) {
        std::
        vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
        ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                   *)local_298);
        ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
        return;
      }
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(\"1\", peer_section1.GetSectionValue(\"SECTION_VALUE\")) == 0");
      exit(1);
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"0\", peer_section0.GetSectionValue(\"SECTION_VALUE\")) == 0");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(\"0\", peer_section.GetSectionValue(\"SECTION_VALUE\")) == 0");
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, GetSectionDictionaries) {
  TemplateDictionary dict("test_GetSectionDictionaries");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    // Add some dummy value into the vector to confirm that the call to
    // GetSectionDictionaries will correctly clear the vector.
    dicts.push_back(NULL);
    EXPECT_EQ(0, peer.GetSectionDictionaries("SECTION", &dicts));
    EXPECT_TRUE(dicts.empty());
  }

  dict.AddSectionDictionary("SECTION")->SetValue("SECTION_VALUE", "0");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    ASSERT_EQ(1, peer.GetSectionDictionaries("SECTION", &dicts));

    TemplateDictionaryPeer peer_section(dicts[0]);
    EXPECT_STREQ("0", peer_section.GetSectionValue("SECTION_VALUE"));
  }

  dict.AddSectionDictionary("SECTION")->SetValue("SECTION_VALUE", "1");
  dict.AddSectionDictionary("ANOTHER_SECTION")->SetValue("ANOTHER_VALUE", "2");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    ASSERT_EQ(2, peer.GetSectionDictionaries("SECTION", &dicts));

    TemplateDictionaryPeer peer_section0(dicts[0]);
    EXPECT_STREQ("0", peer_section0.GetSectionValue("SECTION_VALUE"));

    TemplateDictionaryPeer peer_section1(dicts[1]);
    EXPECT_STREQ("1", peer_section1.GetSectionValue("SECTION_VALUE"));
  }
}